

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall
ocl::OpenCLKernel::setArg(OpenCLKernel *this,cl_uint arg_index,size_t arg_size,void *arg_value)

{
  pointer pcVar1;
  uint uVar2;
  runtime_error *this_00;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = clSetKernelArg(this->kernel_,arg_index,arg_size,arg_value);
  if (uVar2 == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  pcVar1 = (this->kernel_name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar1,pcVar1 + (this->kernel_name_)._M_string_length);
  to_string<std::__cxx11::string>(&local_d0,&local_150);
  std::operator+(&local_b0,"clSetKernelArg ",&local_d0);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_190._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_190._M_dataplus._M_p == psVar4) {
    local_190.field_2._M_allocated_capacity = *psVar4;
    local_190.field_2._8_8_ = plVar3[3];
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  }
  else {
    local_190.field_2._M_allocated_capacity = *psVar4;
  }
  local_190._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  to_string<unsigned_int>(&local_f0,arg_index);
  std::operator+(&local_90,&local_190,&local_f0);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_170._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_170._M_dataplus._M_p == psVar4) {
    local_170.field_2._M_allocated_capacity = *psVar4;
    local_170.field_2._8_8_ = plVar3[3];
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar4;
  }
  local_170._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  to_string<unsigned_long>(&local_110,arg_size);
  std::operator+(&local_70,&local_170,&local_110);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_1b0._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_1b0._M_dataplus._M_p == psVar4) {
    local_1b0.field_2._M_allocated_capacity = *psVar4;
    local_1b0.field_2._8_8_ = plVar3[3];
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar4;
  }
  local_1b0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  errorString_abi_cxx11_(&local_130,(ocl *)(ulong)uVar2,(cl_int)local_1b0._M_string_length);
  std::operator+(&local_50,&local_1b0,&local_130);
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OpenCLKernel::setArg(cl_uint arg_index, size_t arg_size, const void *arg_value)
{
	cl_int ciErrNum = clSetKernelArg(kernel_, arg_index, arg_size, arg_value);

	if (ciErrNum != CL_SUCCESS)
		throw std::runtime_error("clSetKernelArg " + to_string(kernel_name_) + "#" + to_string(arg_index) + " (" +to_string(arg_size) + " bytes) failed: " + errorString(ciErrNum));
}